

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

size_t MeCab::
       tokenizeCSV<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                 (char *str,
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 out,size_t max)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_t local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  size_t local_38;
  
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out.container;
  sVar3 = strlen(str);
  if ((long)sVar3 < 1) {
    local_38 = 0;
  }
  else {
    pcVar7 = str + sVar3;
    local_38 = 0;
    local_48 = max;
    do {
      for (; (cVar2 = *str, cVar2 == '\t' || (cVar2 == ' ')); str = str + 1) {
      }
      if (cVar2 == '\"') {
        str = str + 1;
        pcVar5 = str;
        for (pcVar4 = str;
            (pcVar6 = pcVar4, pcVar4 < pcVar7 &&
            ((*pcVar4 != '\"' ||
             (pcVar6 = pcVar4 + 1, pcVar1 = pcVar4 + 1, pcVar4 = pcVar6, *pcVar1 == '\"'))));
            pcVar4 = pcVar4 + 1) {
          *pcVar5 = *pcVar4;
          pcVar5 = pcVar5 + 1;
        }
        local_68._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar4 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar6,pcVar7,&local_68);
      }
      else {
        local_68._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar5 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (str,pcVar7,&local_68);
        pcVar4 = pcVar5;
      }
      if (1 < max) {
        *pcVar5 = '\0';
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      sVar3 = strlen(str);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,str,str + sVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_40,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      max = max - 1;
      if (max == 0) {
        return local_48;
      }
      local_38 = local_38 + 1;
      str = pcVar4 + 1;
    } while (str < pcVar7);
  }
  return local_38;
}

Assistant:

inline size_t tokenizeCSV(char *str,
                          Iterator out, size_t max) {
  char *eos = str + std::strlen(str);
  char *start = 0;
  char *end = 0;
  size_t n = 0;

  for (; str < eos; ++str) {
    // skip white spaces
     while (*str == ' ' || *str == '\t') ++str;
    if (*str == '"') {
      start = ++str;
      end = start;
      for (; str < eos; ++str) {
        if (*str == '"') {
          str++;
          if (*str != '"')
            break;
        }
        *end++ = *str;
      }
      str = std::find(str, eos, ',');
    } else {
      start = str;
      str = std::find(str, eos, ',');
      end = str;
    }
    if (max-- > 1) *end = '\0';
    *out++ = start;
    ++n;
    if (max == 0) break;
  }

  return n;
}